

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int32_t intersect_skewed_uint16_cardinality
                  (uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  ushort uVar9;
  ushort uVar10;
  uint16_t uVar11;
  int iVar12;
  ushort *puVar13;
  size_t sVar8;
  
  iVar2 = (int)size_l;
  if (size_s == 0) {
    return 0;
  }
  uVar9 = *small;
  iVar6 = iVar2 + -1;
  iVar1 = 0;
  iVar4 = 0;
  sVar7 = 0;
  puVar13 = large;
LAB_0010351a:
  do {
    sVar8 = sVar7;
    while (sVar7 = sVar8 + 1, uVar9 <= *puVar13) {
      if (*puVar13 <= uVar9) {
        iVar1 = iVar1 + 1;
        if (size_s == sVar7) {
          return iVar1;
        }
        uVar9 = small[sVar7];
        iVar12 = iVar4 + 1;
        iVar5 = iVar12;
        if ((iVar2 <= iVar12) || (uVar9 <= large[iVar12])) goto LAB_0010365d;
        iVar4 = iVar4 + 2;
        iVar3 = 1;
        if (iVar2 <= iVar4) goto LAB_00103645;
        iVar5 = 1;
        goto LAB_00103626;
      }
      if (size_s == sVar7) {
        return iVar1;
      }
      sVar8 = sVar7;
      uVar9 = small[sVar7];
    }
    iVar12 = iVar4 + 1;
    iVar5 = iVar12;
    if ((iVar12 < iVar2) && (large[iVar12] < uVar9)) {
      iVar4 = iVar4 + 2;
      iVar5 = 1;
      if (iVar4 < iVar2) {
        iVar3 = 1;
        do {
          uVar11 = large[iVar4];
          if (uVar9 <= uVar11) goto LAB_001035ac;
          iVar5 = iVar3 * 2;
          iVar4 = iVar12 + iVar3 * 2;
          iVar3 = iVar5;
        } while (iVar4 < iVar2);
      }
      uVar11 = large[iVar6];
      iVar3 = iVar5;
      iVar4 = iVar6;
LAB_001035ac:
      iVar5 = iVar4;
      if (((uVar11 != uVar9) && (iVar5 = iVar2, uVar9 <= uVar11)) &&
         (iVar5 = iVar4, (iVar3 >> 1) + iVar12 + 1 != iVar4)) {
        iVar12 = (iVar3 >> 1) + iVar12;
        do {
          iVar5 = iVar12 + iVar4 >> 1;
          if (large[iVar5] == uVar9) break;
          iVar3 = iVar5;
          if (large[iVar5] < uVar9) {
            iVar3 = iVar4;
            iVar12 = iVar5;
          }
          iVar5 = iVar3;
          iVar4 = iVar3;
        } while (iVar12 + 1 != iVar3);
      }
    }
    iVar4 = iVar5;
    if ((long)iVar4 == size_l) {
      return iVar1;
    }
    sVar7 = sVar8;
    puVar13 = large + iVar4;
  } while( true );
  while( true ) {
    iVar3 = iVar5 * 2;
    iVar4 = iVar12 + iVar5 * 2;
    iVar5 = iVar3;
    if (iVar2 <= iVar4) break;
LAB_00103626:
    uVar10 = large[iVar4];
    iVar3 = iVar5;
    if (uVar9 <= uVar10) goto LAB_00103650;
  }
LAB_00103645:
  uVar10 = large[iVar6];
  iVar4 = iVar6;
LAB_00103650:
  iVar5 = iVar4;
  if (((uVar10 != uVar9) && (iVar5 = iVar2, uVar9 <= uVar10)) &&
     (iVar5 = iVar4, (iVar3 >> 1) + iVar12 + 1 != iVar4)) {
    iVar12 = (iVar3 >> 1) + iVar12;
    do {
      iVar5 = iVar12 + iVar4 >> 1;
      if (large[iVar5] == uVar9) break;
      iVar3 = iVar5;
      if (large[iVar5] < uVar9) {
        iVar3 = iVar4;
        iVar12 = iVar5;
      }
      iVar5 = iVar3;
      iVar4 = iVar3;
    } while (iVar12 + 1 != iVar3);
  }
LAB_0010365d:
  iVar4 = iVar5;
  if ((long)iVar4 == size_l) {
    return iVar1;
  }
  puVar13 = large + iVar4;
  goto LAB_0010351a;
}

Assistant:

int32_t intersect_skewed_uint16_cardinality(const uint16_t *small,
                                            size_t size_s,
                                            const uint16_t *large,
                                            size_t size_l) {
    size_t pos = 0, idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return 0;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            pos++;
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        }
    }

    return (int32_t)pos;
}